

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.h
# Opt level: O0

char * __thiscall
btStaticPlaneShape::serialize(btStaticPlaneShape *this,void *dataBuffer,btSerializer *serializer)

{
  btSerializer *in_RSI;
  void *in_RDI;
  btCollisionShape *unaff_retaddr;
  btStaticPlaneShapeData *planeData;
  
  btCollisionShape::serialize(unaff_retaddr,in_RDI,in_RSI);
  btVector3::serializeFloat
            ((btVector3 *)((long)in_RDI + 0x54),(btVector3FloatData *)(in_RSI + 0x10));
  btVector3::serializeFloat
            ((btVector3 *)((long)in_RDI + 0x40),(btVector3FloatData *)(in_RSI + 0x20));
  *(undefined4 *)(in_RSI + 0x30) = *(undefined4 *)((long)in_RDI + 0x50);
  return "btStaticPlaneShapeData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btStaticPlaneShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*) dataBuffer;
	btCollisionShape::serialize(&planeData->m_collisionShapeData,serializer);

	m_localScaling.serializeFloat(planeData->m_localScaling);
	m_planeNormal.serializeFloat(planeData->m_planeNormal);
	planeData->m_planeConstant = float(m_planeConstant);
		
	return "btStaticPlaneShapeData";
}